

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

void POOL_free(POOL_ctx *ctx)

{
  pthread_mutex_t *__mutex;
  size_t i;
  ulong uVar1;
  
  if (ctx != (POOL_ctx *)0x0) {
    __mutex = &ctx->queueMutex;
    pthread_mutex_lock((pthread_mutex_t *)__mutex);
    ctx->shutdown = 1;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    pthread_cond_broadcast((pthread_cond_t *)&ctx->queuePushCond);
    pthread_cond_broadcast((pthread_cond_t *)&ctx->queuePopCond);
    for (uVar1 = 0; uVar1 < ctx->threadCapacity; uVar1 = uVar1 + 1) {
      pthread_join(ctx->threads[uVar1],(void **)0x0);
    }
    pthread_mutex_destroy((pthread_mutex_t *)__mutex);
    pthread_cond_destroy((pthread_cond_t *)&ctx->queuePushCond);
    pthread_cond_destroy((pthread_cond_t *)&ctx->queuePopCond);
    ZSTD_customFree(ctx->queue,ctx->customMem);
    ZSTD_customFree(ctx->threads,ctx->customMem);
    ZSTD_customFree(ctx,ctx->customMem);
  }
  return;
}

Assistant:

void POOL_free(POOL_ctx *ctx) {
    if (!ctx) { return; }
    POOL_join(ctx);
    ZSTD_pthread_mutex_destroy(&ctx->queueMutex);
    ZSTD_pthread_cond_destroy(&ctx->queuePushCond);
    ZSTD_pthread_cond_destroy(&ctx->queuePopCond);
    ZSTD_customFree(ctx->queue, ctx->customMem);
    ZSTD_customFree(ctx->threads, ctx->customMem);
    ZSTD_customFree(ctx, ctx->customMem);
}